

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Colour.cpp
# Opt level: O0

void __thiscall Colour::Colour(Colour *this,string *name,int hexValue)

{
  GLfloat *pGVar1;
  int hexValue_local;
  string *name_local;
  Colour *this_local;
  
  std::__cxx11::string::string((string *)&this->name);
  this->r = (uint)hexValue >> 0x10 & 0xff;
  this->g = (uint)hexValue >> 8 & 0xff;
  this->b = hexValue & 0xff;
  pGVar1 = (GLfloat *)operator_new__(0xc);
  this->colour = pGVar1;
  *this->colour = (float)this->r / 255.0;
  this->colour[1] = (float)this->g / 255.0;
  this->colour[2] = (float)this->b / 255.0;
  std::__cxx11::string::operator=((string *)&this->name,(string *)name);
  return;
}

Assistant:

Colour::Colour(const string& name, int hexValue) {
    r = ((hexValue >> 16) & 0xff);
    g = ((hexValue >> 8) & 0xff);
    b = (hexValue & 0xff);
    
    colour = new GLfloat[3];
    this->colour[0] = r/255.f;
    this->colour[1] = g/255.f;
    this->colour[2] = b/255.f;
    
    this->name = name;
}